

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O1

int Llb_ManTracePaths(Aig_Man_t *p,Aig_Obj_t *pPivot)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  Aig_ManIncrementTravId(p);
  Aig_ManIncrementTravId(p);
  if (p->nRegs < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    iVar4 = 0;
    do {
      uVar1 = p->nTruePis + iVar4;
      if (((int)uVar1 < 0) || (p->vCis->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = Llb_ManTracePaths_rec(p,(Aig_Obj_t *)p->vCis->pArray[uVar1],pPivot);
      iVar3 = iVar3 + iVar2;
      iVar4 = iVar4 + 1;
    } while (iVar4 < p->nRegs);
  }
  return iVar3;
}

Assistant:

int Llb_ManTracePaths( Aig_Man_t * p, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManIncrementTravId( p ); // prev = visited with path to LI  (value 0)
    Aig_ManIncrementTravId( p ); // cur  = visited w/o  path to LI  (value 1)
    Saig_ManForEachLo( p, pObj, i )
        Counter += Llb_ManTracePaths_rec( p, pObj, pPivot );
    return Counter;
}